

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O2

DWORD GetFullPathNameW(LPCWSTR lpFileName,DWORD nBufferLength,LPWSTR lpBuffer,LPWSTR *lpFilePart)

{
  undefined8 uVar1;
  long lVar2;
  LPSTR lpWideCharStr;
  int iVar3;
  DWORD DVar4;
  char *lpBuffer_00;
  ulong uVar5;
  undefined8 *puVar6;
  CHAR *pCVar7;
  CHAR *pCVar8;
  DWORD DVar9;
  long in_FS_OFFSET;
  undefined8 uStackY_b0;
  CHAR aCStack_98 [8];
  int local_90 [2];
  LPSTR lpFilePartA;
  LPWSTR *local_80;
  undefined1 local_78 [8];
  PathCharString bufferAPS;
  
  bufferAPS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  bufferAPS._32_8_ = local_78;
  bufferAPS.m_size = 0;
  pCVar8 = aCStack_98;
  lpFilePartA = (LPSTR)lpBuffer;
  local_80 = lpFilePart;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002d957d;
  uStackY_b0 = 0x2d938e;
  iVar3 = WideCharToMultiByte(0,0,lpFileName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar3 == 0) {
    puVar6 = (undefined8 *)&stack0xffffffffffffff60;
LAB_002d94c9:
    uVar1 = *puVar6;
    pCVar7 = (CHAR *)(puVar6 + 1);
    *puVar6 = 0x2d94cf;
    SetLastError((DWORD)uVar1);
LAB_002d9518:
    DVar4 = 0;
  }
  else {
    lVar2 = -((long)iVar3 + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)(&stack0xffffffffffffff58 + lVar2) = 0;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0;
    *(undefined8 *)((long)&uStackY_b0 + lVar2) = 0xffffffffffffffff;
    uVar1 = *(undefined8 *)((long)&uStackY_b0 + lVar2);
    *(undefined8 *)((long)&uStackY_b0 + lVar2) = 0x2d93cc;
    iVar3 = WideCharToMultiByte(0,0,lpFileName,(int)uVar1,aCStack_98 + lVar2,iVar3,
                                *(LPCSTR *)(&stack0xffffffffffffff58 + lVar2),
                                *(LPBOOL *)(&stack0xffffffffffffff60 + lVar2));
    pCVar8 = aCStack_98 + lVar2;
    pCVar7 = aCStack_98 + lVar2;
    if (iVar3 == 0) {
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d94af;
      DVar9 = GetLastError();
      if (DVar9 == 0x7a) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_002d957d;
      }
      else {
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d94fd;
        fprintf(_stderr,"] %s %s:%d","GetFullPathNameW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                ,0xf6);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9510;
        fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar9);
      }
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x57;
      uVar1 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar2);
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9518;
      SetLastError((DWORD)uVar1);
      goto LAB_002d9518;
    }
    DVar9 = MaxWCharToAcpLengthRatio << 10;
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d93f3;
    lpBuffer_00 = StackString<32UL,_char>::OpenStringBuffer
                            ((StackString<32UL,_char> *)local_78,(long)(int)DVar9);
    if (lpBuffer_00 == (char *)0x0) {
      puVar6 = (undefined8 *)(&stack0xffffffffffffff60 + lVar2);
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 8;
      goto LAB_002d94c9;
    }
    *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9414;
    DVar4 = GetFullPathNameA(aCStack_98 + lVar2,DVar9,lpBuffer_00,(LPSTR *)local_90);
    uVar5 = (ulong)DVar4;
    if (uVar5 < bufferAPS.m_size) {
      bufferAPS.m_size = uVar5;
    }
    *(undefined1 *)(bufferAPS._32_8_ + bufferAPS.m_size) = 0;
    pCVar7 = aCStack_98 + lVar2;
    if (uVar5 <= (ulong)(long)(int)DVar9 && DVar4 != 0) {
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0xffffffffffffffff;
      lpWideCharStr = lpFilePartA;
      uVar1 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar2);
      *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d945b;
      iVar3 = MultiByteToWideChar(0,0,lpBuffer_00,(int)uVar1,(LPWSTR)lpWideCharStr,nBufferLength);
      if (iVar3 == 0) {
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9556;
        DVar9 = GetLastError();
        pCVar7 = aCStack_98 + lVar2;
        if (DVar9 != 0x7a) goto LAB_002d9518;
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0xffffffffffffffff;
        uVar1 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar2);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9570;
        DVar4 = MultiByteToWideChar(0,0,lpBuffer_00,(int)uVar1,(LPWSTR)0x0,0);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x6f;
        uVar1 = *(undefined8 *)(&stack0xffffffffffffff60 + lVar2);
        *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d957b;
        SetLastError((DWORD)uVar1);
        pCVar7 = aCStack_98 + lVar2;
      }
      else {
        DVar4 = iVar3 - 1;
        pCVar7 = aCStack_98 + lVar2;
        if (local_80 != (LPWSTR *)0x0) {
          *local_80 = (LPWSTR)lpFilePartA;
          *(undefined8 *)(&stack0xffffffffffffff60 + lVar2) = 0x2d9498;
          iVar3 = MultiByteToWideChar(0,0,lpBuffer_00,local_90[0] - (int)lpBuffer_00,(LPWSTR)0x0,0);
          *local_80 = *local_80 + iVar3;
          pCVar7 = aCStack_98 + lVar2;
        }
      }
    }
  }
  pCVar8 = pCVar7;
  if (PAL_InitializeChakraCoreCalled != false) {
    *(undefined8 *)(pCVar7 + -8) = 0x2d9530;
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != bufferAPS.m_count) {
      *(code **)(pCVar7 + -8) = GetLongPathNameW;
      __stack_chk_fail();
    }
    return DVar4;
  }
LAB_002d957d:
  *(undefined1 **)(pCVar8 + -8) = &LAB_002d9582;
  abort();
}

Assistant:

DWORD
PALAPI
GetFullPathNameW(
     IN LPCWSTR lpFileName,
     IN DWORD nBufferLength,
     OUT LPWSTR lpBuffer,
     OUT LPWSTR *lpFilePart)
{
    LPSTR fileNameA;
    /* bufferA needs to be able to hold a path that's potentially as
       large as MAX_LONGPATH WCHARs. */
    CHAR * bufferA;
    size_t bufferASize = 0;
    PathCharString bufferAPS;
    LPSTR lpFilePartA;
    int   fileNameLength;
    int   srcSize;
    DWORD length;
    DWORD nRet = 0;

    PERF_ENTRY(GetFullPathNameW);
    ENTRY("GetFullPathNameW(lpFileName=%p (%S), nBufferLength=%u, lpBuffer=%p"
          ", lpFilePart=%p)\n",
          lpFileName?lpFileName:W16_NULLSTRING,
          lpFileName?lpFileName:W16_NULLSTRING, nBufferLength,
          lpBuffer, lpFilePart);

    /* Find the number of bytes required to convert lpFileName
       to ANSI. This may be more than MAX_LONGPATH. We try to
       handle that case, since it may be less than MAX_LONGPATH
       WCHARs. */

    fileNameLength = WideCharToMultiByte(CP_ACP, 0, lpFileName,
                                         -1, NULL, 0, NULL, NULL);
    if (fileNameLength == 0)
    {
        /* Couldn't convert to ANSI. That's odd. */
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }
    else
    {
        fileNameA = static_cast<LPSTR>(alloca(fileNameLength));
    }

    /* Now convert lpFileName to ANSI. */
    srcSize = WideCharToMultiByte (CP_ACP, 0, lpFileName,
                                   -1, fileNameA, fileNameLength,
                                   NULL, NULL );
    if( srcSize == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            ERROR("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
        }
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    bufferASize = MAX_LONGPATH * MaxWCharToAcpLengthRatio;
    bufferA = bufferAPS.OpenStringBuffer(bufferASize);
    if (NULL == bufferA)
    {
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto done;
    }
    length = GetFullPathNameA(fileNameA, bufferASize, bufferA, &lpFilePartA);
    bufferAPS.CloseBuffer(length);

    if (length == 0 || length > bufferASize)
    {
        /* Last error is set by GetFullPathNameA */
        nRet = length;
        goto done;
    }

    /* Convert back to Unicode the result */
    nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                lpBuffer, nBufferLength );

    if (nRet == 0)
    {
        if ( GetLastError() == ERROR_INSUFFICIENT_BUFFER )
        {
            /* get the required length */
            nRet = MultiByteToWideChar( CP_ACP, 0, bufferA, -1,
                                        NULL, 0 );
            SetLastError(ERROR_BUFFER_OVERFLOW);
        }

        goto done;
    }

    /* MultiByteToWideChar counts the trailing NULL, but
       GetFullPathName does not. */
    nRet--;

    /* now set lpFilePart */
    if (lpFilePart != NULL)
    {
        *lpFilePart = lpBuffer;
        *lpFilePart += MultiByteToWideChar( CP_ACP, 0, bufferA,
                                            lpFilePartA - bufferA, NULL, 0);
    }

done:
    LOGEXIT("GetFullPathNameW returns DWORD %u\n", nRet);
    PERF_EXIT(GetFullPathNameW);
    return nRet;
}